

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_base_cancel_single_callback_(event_base *base,event_callback *evcb,int run_finalizers)

{
  uint8_t uVar1;
  event *peVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *pvVar3;
  void *extraout_RDX_03;
  bool bVar4;
  event *ev_1;
  event *ev;
  int result;
  int run_finalizers_local;
  event_callback *evcb_local;
  event_base *base_local;
  
  if ((evcb->evcb_flags & 0x80U) == 0) {
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,base->th_base_lock);
    }
    event_callback_cancel_nolock_(base,evcb,1);
    pvVar3 = extraout_RDX_01;
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
      pvVar3 = extraout_RDX_02;
    }
    ev._0_4_ = 1;
  }
  else {
    peVar2 = event_callback_to_event(evcb);
    bVar4 = ((peVar2->ev_evcallback).evcb_flags & 0x10U) == 0;
    pvVar3 = extraout_RDX;
    if (bVar4) {
      event_del_(peVar2,3);
      pvVar3 = extraout_RDX_00;
    }
    ev._0_4_ = (uint)bVar4;
  }
  if ((run_finalizers != 0) && ((evcb->evcb_flags & 0x40U) != 0)) {
    uVar1 = evcb->evcb_closure;
    if (uVar1 == '\x04') {
      (*(evcb->evcb_cb_union).evcb_callback)((int)evcb,(short)evcb->evcb_arg,pvVar3);
    }
    else if (uVar1 == '\x05' || uVar1 == '\x06') {
      peVar2 = event_callback_to_event(evcb);
      (*(peVar2->ev_evcallback).evcb_cb_union.evcb_callback)
                ((int)peVar2,(short)(peVar2->ev_evcallback).evcb_arg,extraout_RDX_03);
      if (evcb->evcb_closure == '\x06') {
        event_mm_free_(peVar2);
      }
    }
  }
  return (uint)ev;
}

Assistant:

static int
event_base_cancel_single_callback_(struct event_base *base,
    struct event_callback *evcb,
    int run_finalizers)
{
	int result = 0;

	if (evcb->evcb_flags & EVLIST_INIT) {
		struct event *ev = event_callback_to_event(evcb);
		if (!(ev->ev_flags & EVLIST_INTERNAL)) {
			event_del_(ev, EVENT_DEL_EVEN_IF_FINALIZING);
			result = 1;
		}
	} else {
		EVBASE_ACQUIRE_LOCK(base, th_base_lock);
		event_callback_cancel_nolock_(base, evcb, 1);
		EVBASE_RELEASE_LOCK(base, th_base_lock);
		result = 1;
	}

	if (run_finalizers && (evcb->evcb_flags & EVLIST_FINALIZING)) {
		switch (evcb->evcb_closure) {
		case EV_CLOSURE_EVENT_FINALIZE:
		case EV_CLOSURE_EVENT_FINALIZE_FREE: {
			struct event *ev = event_callback_to_event(evcb);
			ev->ev_evcallback.evcb_cb_union.evcb_evfinalize(ev, ev->ev_arg);
			if (evcb->evcb_closure == EV_CLOSURE_EVENT_FINALIZE_FREE)
				mm_free(ev);
			break;
		}
		case EV_CLOSURE_CB_FINALIZE:
			evcb->evcb_cb_union.evcb_cbfinalize(evcb, evcb->evcb_arg);
			break;
		default:
			break;
		}
	}
	return result;
}